

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

LOs __thiscall Omega_h::multiply_fans(Omega_h *this,LOs *a2b,LOs *a2c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  LOs LVar5;
  LOs degrees;
  LOs c_degrees;
  LOs b_degrees;
  string local_e0;
  Read<int> local_c0;
  Read<int> local_b0;
  Read<int> local_a0;
  LOs local_90;
  LOs local_80;
  Write<int> local_70;
  Read<signed_char> local_60;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  void *pvVar4;
  
  local_80.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.write_.shared_alloc_.alloc)->use_count =
           (local_80.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  get_degrees((Omega_h *)&local_40,&local_80,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_90.write_.shared_alloc_.alloc = (a2c->write_).shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (a2c->write_).shared_alloc_.direct_ptr;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  get_degrees((Omega_h *)&local_50,&local_90,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_a0.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_38;
  local_b0.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_48;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  multiply_each<int>((Omega_h *)&local_70,&local_a0,&local_b0,&local_e0);
  Read<int>::Read(&local_60,&local_70);
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_70.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(local_70.shared_alloc_.alloc,0x48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_c0.write_.shared_alloc_.alloc = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.write_.shared_alloc_.direct_ptr = local_60.write_.shared_alloc_.direct_ptr;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  LVar5 = offset_scan<int>(this,&local_c0,&local_e0);
  pvVar4 = LVar5.write_.shared_alloc_.direct_ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    pvVar4 = extraout_RDX;
  }
  pAVar3 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(local_60.write_.shared_alloc_.alloc,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar2 = &local_50->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar2 = &local_40->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  LVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  LVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar5.write_.shared_alloc_;
}

Assistant:

LOs multiply_fans(LOs a2b, LOs a2c) {
  auto b_degrees = get_degrees(a2b);
  auto c_degrees = get_degrees(a2c);
  LOs degrees = multiply_each(b_degrees, c_degrees);
  auto a2bc = offset_scan(degrees);
  return a2bc;
}